

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O0

bool __thiscall
FMB::FiniteModelMultiSorted::evaluateGroundLiteral(FiniteModelMultiSorted *this,Literal *lit)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  undefined8 uVar6;
  size_t sVar7;
  Term *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  UserErrorException *this_01;
  Term *in_RSI;
  DArray<unsigned_int> *in_RDI;
  bool in_stack_00000057;
  Term *in_stack_00000058;
  char res;
  uint s;
  uint i_1;
  uint mult;
  uint var;
  OperatorType *sig;
  bool res_1;
  uint i;
  DArray<unsigned_int> args;
  uint arity;
  undefined4 in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd5c;
  Signature *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  Symbol *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  FiniteModelMultiSorted *in_stack_fffffffffffffec8;
  uint local_12c;
  int local_128;
  uint local_124;
  uint local_3c;
  Literal *in_stack_ffffffffffffffc8;
  bool local_1;
  
  Kernel::Term::functor(in_RSI);
  uVar2 = Kernel::Signature::predicateArity(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  Lib::DArray<unsigned_int>::DArray
            ((DArray<unsigned_int> *)in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
  for (local_3c = 0; local_3c < uVar2; local_3c = local_3c + 1) {
    Kernel::Term::nthArgument(in_RSI,local_3c);
    Kernel::TermList::term((TermList *)0x2d6c8d);
    uVar3 = evaluateGroundTerm(in_stack_fffffffffffffec8,
                               (Term *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0)
                              );
    puVar5 = Lib::DArray<unsigned_int>::operator[]
                       ((DArray<unsigned_int> *)&stack0xffffffffffffffc8,(ulong)local_3c);
    *puVar5 = uVar3;
    puVar5 = Lib::DArray<unsigned_int>::operator[]
                       ((DArray<unsigned_int> *)&stack0xffffffffffffffc8,(ulong)local_3c);
    if (*puVar5 == 0) {
      uVar6 = __cxa_allocate_exception(0x50);
      Kernel::Literal::toString_abi_cxx11_(in_stack_ffffffffffffffc8);
      std::operator+((char *)in_stack_fffffffffffffd68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd60);
      std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
      Kernel::Term::nthArgument(in_RSI,local_3c);
      Kernel::TermList::term((TermList *)0x2d6daf);
      Kernel::Term::toString_abi_cxx11_(in_stack_00000058,in_stack_00000057);
      std::operator+(in_stack_fffffffffffffd98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
      Lib::UserErrorException::Exception
                ((UserErrorException *)in_stack_fffffffffffffd60,
                 (string *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
  }
  bVar1 = Kernel::Literal::isEquality((Literal *)0x2d6f9c);
  if (bVar1) {
    puVar5 = Lib::DArray<unsigned_int>::operator[]
                       ((DArray<unsigned_int> *)&stack0xffffffffffffffc8,0);
    uVar2 = *puVar5;
    puVar5 = Lib::DArray<unsigned_int>::operator[]
                       ((DArray<unsigned_int> *)&stack0xffffffffffffffc8,1);
    local_1 = uVar2 == *puVar5;
    iVar4 = Kernel::Literal::polarity((Literal *)0x2d7025);
    if (iVar4 == 0) {
      local_1 = (bool)((local_1 ^ 0xffU) & 1);
    }
  }
  else {
    Kernel::Term::functor(in_RSI);
    Kernel::Signature::getPredicate(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    Kernel::Signature::Symbol::predType(in_stack_fffffffffffffd70);
    uVar2 = Kernel::Term::functor(in_RSI);
    puVar5 = Lib::DArray<unsigned_int>::operator[](in_RDI + 2,(ulong)uVar2);
    local_124 = *puVar5;
    local_128 = 1;
    for (local_12c = 0;
        sVar7 = Lib::DArray<unsigned_int>::size((DArray<unsigned_int> *)&stack0xffffffffffffffc8),
        local_12c < sVar7; local_12c = local_12c + 1) {
      iVar4 = local_128;
      puVar5 = Lib::DArray<unsigned_int>::operator[]
                         ((DArray<unsigned_int> *)&stack0xffffffffffffffc8,(ulong)local_12c);
      local_124 = local_124 + iVar4 * (*puVar5 - 1);
      Kernel::OperatorType::arg
                ((OperatorType *)in_stack_fffffffffffffd68,
                 (uint)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      this_00 = Kernel::TermList::term((TermList *)0x2d71ef);
      uVar2 = Kernel::Term::functor(this_00);
      puVar5 = Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)uVar2);
      local_128 = *puVar5 * local_128;
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Lib::DArray<char>::operator[]((DArray<char> *)(in_RDI + 4),(ulong)local_124);
    if (__lhs->_M_dataplus == (_Alloc_hider)0x0) {
      this_01 = (UserErrorException *)__cxa_allocate_exception(0x50);
      Kernel::Literal::toString_abi_cxx11_(in_stack_ffffffffffffffc8);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      std::operator+(__lhs,(char *)this_01);
      Lib::UserErrorException::Exception
                (this_01,(string *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      __cxa_throw(this_01,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    uVar2 = (uint)(__lhs->_M_dataplus == (_Alloc_hider)0x2);
    uVar3 = Kernel::Literal::polarity((Literal *)0x2d73f1);
    local_1 = uVar2 == uVar3;
  }
  Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffffd60);
  return local_1;
}

Assistant:

bool FiniteModelMultiSorted::evaluateGroundLiteral(Literal* lit)
{
  ASS(lit->ground());

#if DEBUG_MODEL
  cout << "Evaluating ground literal " << lit->toString() << endl;
#endif

  // evaluate all arguments
  unsigned arity = env.signature->predicateArity(lit->functor());
  DArray<unsigned> args(arity);
  for(unsigned i=0;i<arity;i++){
    args[i] = evaluateGroundTerm(lit->nthArgument(i)->term());
    if(args[i]==0) USER_ERROR("Could not evaluate "+lit->toString()+
                    " on "+(lit->nthArgument(i)->term()->toString())+
                    ", probably a partial model");
  }

  if(lit->isEquality()){
    bool res = args[0]==args[1];
#if DEBUG_MODEL
    cout << "Evaluate equality, args " << args[0] << " and " << args[1] << endl;
    cout << "res is " << (lit->polarity() ? res : !res) << endl;
#endif
    if(lit->polarity()) return res;
    else return !res;
  }

  OperatorType* sig = env.signature->getPredicate(lit->functor())->predType();
  unsigned var = _p_offsets[lit->functor()];
  unsigned mult = 1;
  for(unsigned i=0;i<args.size();i++){
    var += mult*(args[i]-1);
    unsigned s = sig->arg(i).term()->functor();
    mult *=_sizes[s];
  }

#if VDEBUG
  if((lit->functor()+1)<_p_offsets.size()) ASS_L(var,_p_offsets[lit->functor()+1]);
#endif
  ASS_L(var,_p_interpretation.size());

  char res = _p_interpretation[var];
#if DEBUG_MODEL
    cout << "res is " << res << " and polarity is " << lit->polarity() << endl;
#endif

  if(res==INTP_UNDEF)
    USER_ERROR("Could not evaluate "+lit->toString()+", probably a partial model");

  return (res==INTP_TRUE) == (lit->polarity());
}